

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
mp::internal::ExprBase::
Create<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
          (Impl *impl)

{
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> in_RDI;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> expr;
  
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>::
  BasicIfExpr((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>
               *)0x149d53);
  return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65>)
         (Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }